

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O0

QAbstractAnimation * __thiscall QAnimationGroup::takeAnimation(QAnimationGroup *this,int index)

{
  QAnimationGroupPrivate *pQVar1;
  qsizetype qVar2;
  const_reference ppQVar3;
  QAbstractAnimationPrivate *pQVar4;
  uint in_ESI;
  long in_FS_OFFSET;
  QAbstractAnimation *animation;
  QAnimationGroupPrivate *d;
  QObject *in_stack_ffffffffffffff98;
  QObject *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  QMessageLogger *in_stack_ffffffffffffffb0;
  QAbstractAnimation *local_30;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QAnimationGroup *)0x67bb89);
  if (-1 < (int)in_ESI) {
    in_stack_ffffffffffffffa8 = (char *)(long)(int)in_ESI;
    qVar2 = QList<QAbstractAnimation_*>::size(&pQVar1->animations);
    if ((long)in_stack_ffffffffffffffa8 < qVar2) {
      ppQVar3 = QList<QAbstractAnimation_*>::at
                          ((QList<QAbstractAnimation_*> *)in_stack_ffffffffffffffa0,
                           (qsizetype)in_stack_ffffffffffffff98);
      local_30 = *ppQVar3;
      pQVar4 = QAbstractAnimationPrivate::get((QAbstractAnimation *)0x67bc1a);
      pQVar4->group = (QAnimationGroup *)0x0;
      QList<QAbstractAnimation_*>::removeAt
                ((QList<QAbstractAnimation_*> *)in_stack_ffffffffffffffa0,
                 (qsizetype)in_stack_ffffffffffffff98);
      QObject::setParent(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      (*(pQVar1->super_QAbstractAnimationPrivate).super_QObjectPrivate.super_QObjectData.
        _vptr_QObjectData[5])(pQVar1,(long)(int)in_ESI,local_30);
      goto LAB_0067bc68;
    }
  }
  QMessageLogger::QMessageLogger
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(char *)in_stack_ffffffffffffff98);
  QMessageLogger::warning
            (&local_28,"QAnimationGroup::takeAnimation: no animation at index %d",(ulong)in_ESI);
  local_30 = (QAbstractAnimation *)0x0;
LAB_0067bc68:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractAnimation *QAnimationGroup::takeAnimation(int index)
{
    Q_D(QAnimationGroup);
    if (index < 0 || index >= d->animations.size()) {
        qWarning("QAnimationGroup::takeAnimation: no animation at index %d", index);
        return nullptr;
    }
    QAbstractAnimation *animation = d->animations.at(index);
    QAbstractAnimationPrivate::get(animation)->group = nullptr;
    // ### removing from list before doing setParent to avoid infinite recursion
    // in ChildRemoved event
    d->animations.removeAt(index);
    animation->setParent(nullptr);
    d->animationRemoved(index, animation);
    return animation;
}